

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O0

ServiceEnumeration * icu_63::ServiceEnumeration::create(ICULocaleService *service)

{
  UBool UVar1;
  ICULocaleService *this;
  size_t in_RSI;
  ICULocaleService *local_48;
  ServiceEnumeration *result;
  ICULocaleService *pIStack_18;
  UErrorCode status;
  ICULocaleService *service_local;
  
  result._4_4_ = U_ZERO_ERROR;
  pIStack_18 = service;
  this = (ICULocaleService *)UMemory::operator_new((UMemory *)0xb8,in_RSI);
  local_48 = (ICULocaleService *)0x0;
  if (this != (ICULocaleService *)0x0) {
    ServiceEnumeration((ServiceEnumeration *)this,pIStack_18,(UErrorCode *)((long)&result + 4));
    local_48 = this;
  }
  UVar1 = ::U_SUCCESS(result._4_4_);
  if (UVar1 == '\0') {
    if (local_48 != (ICULocaleService *)0x0) {
      (*(local_48->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[1])();
    }
    service_local = (ICULocaleService *)0x0;
  }
  else {
    service_local = local_48;
  }
  return (ServiceEnumeration *)service_local;
}

Assistant:

static ServiceEnumeration* create(const ICULocaleService* service) {
        UErrorCode status = U_ZERO_ERROR;
        ServiceEnumeration* result = new ServiceEnumeration(service, status);
        if (U_SUCCESS(status)) {
            return result;
        }
        delete result;
        return NULL;
    }